

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

uint8_t * __thiscall
cdns_qr_extended::parse_map_item
          (cdns_qr_extended *this,uint8_t *in,uint8_t *in_max,int64_t val,int *err)

{
  int *err_local;
  int64_t val_local;
  uint8_t *in_max_local;
  uint8_t *in_local;
  cdns_qr_extended *this_local;
  
  switch(val) {
  case 0:
    in_max_local = cbor_parse_int(in,in_max,&this->question_index,0,err);
    break;
  case 1:
    in_max_local = cbor_parse_int(in,in_max,&this->answer_index,0,err);
    break;
  case 2:
    in_max_local = cbor_parse_int(in,in_max,&this->authority_index,0,err);
    break;
  case 3:
    in_max_local = cbor_parse_int(in,in_max,&this->additional_index,0,err);
    break;
  default:
    in_max_local = cbor_skip(in,in_max,err);
  }
  return in_max_local;
}

Assistant:

uint8_t* cdns_qr_extended::parse_map_item(uint8_t* in, uint8_t const* in_max, int64_t val, int* err)
{
    switch (val) {
    case 0: // question_index
        in = cbor_parse_int(in, in_max, &question_index, 0, err);
        break;
    case 1: // answer_index
        in = cbor_parse_int(in, in_max, &answer_index, 0, err);
        break;
    case 2: // authority_index
        in = cbor_parse_int(in, in_max, &authority_index, 0, err);
        break;
    case 3: // additional_index
        in = cbor_parse_int(in, in_max, &additional_index, 0, err);
        break;
    default:
        /* TODO: something */
        in = cbor_skip(in, in_max, err);
        break;
    }
    return in;
}